

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.c
# Opt level: O1

int main(int argc,char **argv)

{
  wasm_global_t *pwVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 uVar4;
  FILE *__stream;
  size_t sVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  wasm_global_t *pwVar11;
  char *pcVar12;
  wasm_val_t val33;
  wasm_val_t args73 [1];
  wasm_val_t val_12;
  wasm_byte_vec_t binary;
  wasm_extern_vec_t exports;
  wasm_val_t args78 [1];
  wasm_val_t args77 [1];
  wasm_val_t args74 [1];
  wasm_val_t val38;
  wasm_val_t val37;
  wasm_val_t val34;
  wasm_val_t val_i64_4;
  wasm_val_t val_f32_3;
  wasm_val_t val_i64_2;
  wasm_val_t val_f32_1;
  wasm_extern_t *imports [4];
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  float fStack_1f0;
  undefined4 uStack_1ec;
  wasm_global_t *local_1e0;
  wasm_global_t *local_1d8;
  undefined8 local_1d0;
  undefined4 local_1c8;
  undefined4 uStack_1c4;
  float fStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b8 [8];
  float local_1b0;
  undefined4 uStack_1ac;
  wasm_func_t *local_1a0;
  wasm_func_t *local_198;
  wasm_func_t *local_190;
  wasm_func_t *local_188;
  undefined8 local_180;
  undefined8 local_178;
  wasm_func_t *local_170;
  wasm_func_t *local_168;
  wasm_func_t *local_160;
  wasm_func_t *local_158;
  wasm_func_t *local_150;
  wasm_func_t *local_148;
  wasm_func_t *local_140;
  wasm_func_t *local_138;
  wasm_global_t *local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined1 local_118 [8];
  void *local_110;
  wasm_extern_vec_t local_108;
  undefined4 local_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 local_c8;
  undefined4 uStack_c4;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  
  pcVar12 = "Initializing...";
  puts("Initializing...");
  iVar3 = printf(pcVar12);
  uVar4 = wasm_store_new(CONCAT44(extraout_var,iVar3));
  puts("Loading binary...");
  __stream = fopen("global.wasm","r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar5 = ftell(__stream);
    fseek(__stream,0,0);
    wasm_byte_vec_new_uninitialized(local_118,sVar5);
    sVar5 = fread(local_110,sVar5,1,__stream);
    if (sVar5 == 1) {
      fclose(__stream);
      puts("Compiling module...");
      local_1d8 = (wasm_global_t *)wasm_module_new(uVar4,local_118);
      if (local_1d8 != (wasm_global_t *)0x0) {
        local_128 = CONCAT44(extraout_var,iVar3);
        wasm_byte_vec_delete(local_118);
        puts("Creating globals...");
        uVar6 = wasm_valtype_new(2);
        uVar6 = wasm_globaltype_new(uVar6,0);
        iVar3 = 1;
        uVar7 = wasm_valtype_new(1);
        uVar7 = wasm_globaltype_new(uVar7,0);
        local_1d0 = uVar7;
        uVar8 = wasm_valtype_new(2);
        uVar8 = wasm_globaltype_new(uVar8,1);
        uVar9 = wasm_valtype_new(1);
        local_1e0 = (wasm_global_t *)wasm_globaltype_new(uVar9,1);
        local_68 = 2;
        uStack_64 = 0;
        uStack_60 = 0x3f800000;
        uStack_5c = 0;
        local_178 = wasm_global_new(uVar4,uVar6);
        local_78 = 1;
        uStack_74 = 0;
        uStack_70 = 2;
        uStack_6c = 0;
        local_180 = wasm_global_new(uVar4,uVar7);
        local_88 = 2;
        uStack_84 = 0;
        uStack_80 = 0x40400000;
        uStack_7c = 0;
        local_120 = wasm_global_new(uVar4,uVar8);
        pwVar11 = local_1e0;
        local_98 = 1;
        uStack_94 = 0;
        uStack_90 = 4;
        uStack_8c = 0;
        uVar7 = wasm_global_new(uVar4,local_1e0);
        wasm_globaltype_delete(uVar6);
        wasm_globaltype_delete(local_1d0);
        wasm_globaltype_delete(uVar8);
        pwVar1 = local_1d8;
        wasm_globaltype_delete(pwVar11);
        puts("Instantiating module...");
        local_58 = wasm_global_as_extern(local_178);
        uVar6 = local_120;
        local_50 = wasm_global_as_extern(local_180);
        local_48 = wasm_global_as_extern(uVar6);
        local_1d0 = uVar7;
        local_40 = wasm_global_as_extern(uVar7);
        lVar10 = wasm_instance_new(uVar4,pwVar1,&local_58,0);
        if (lVar10 == 0) {
          pcVar12 = "> Error instantiating module!";
LAB_00101e2d:
          puts(pcVar12);
          return iVar3;
        }
        wasm_module_delete(pwVar1);
        puts("Extracting exports...");
        wasm_instance_exports(lVar10);
        pwVar11 = get_export_global(&local_108,0);
        local_130 = get_export_global(&local_108,1);
        local_1d8 = get_export_global(&local_108,2);
        local_1e0 = get_export_global(&local_108,3);
        local_138 = get_export_func(&local_108,4);
        local_140 = get_export_func(&local_108,5);
        local_188 = get_export_func(&local_108,6);
        local_190 = get_export_func(&local_108,7);
        local_148 = get_export_func(&local_108,8);
        local_150 = get_export_func(&local_108,9);
        local_198 = get_export_func(&local_108,10);
        local_1a0 = get_export_func(&local_108,0xb);
        local_170 = get_export_func(&local_108,0xc);
        local_168 = get_export_func(&local_108,0xd);
        local_160 = get_export_func(&local_108,0xe);
        local_158 = get_export_func(&local_108,0xf);
        uVar7 = wasm_global_copy(uVar6);
        cVar2 = wasm_global_same(uVar6,uVar7);
        if (cVar2 == '\0') {
          __assert_fail("wasm_global_same(var_f32_import, copy)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/third_party/wasm-c-api/example/global.c"
                        ,0x98,"int main(int, const char **)");
        }
        wasm_global_delete(uVar7);
        puts("Accessing globals...");
        wasm_global_get(local_178,&local_1f8);
        uVar7 = local_128;
        if (((fStack_1f0 == 1.0) && (!NAN(fStack_1f0))) &&
           (wasm_global_get(local_180,&local_1f8), CONCAT44(uStack_1ec,fStack_1f0) == 2)) {
          wasm_global_get(uVar6,&local_1f8);
          if (((fStack_1f0 == 3.0) && (!NAN(fStack_1f0))) &&
             (wasm_global_get(local_1d0,&local_1f8), CONCAT44(uStack_1ec,fStack_1f0) == 4)) {
            wasm_global_get(pwVar11,&local_1f8);
            if (((fStack_1f0 == 5.0) && (!NAN(fStack_1f0))) &&
               (wasm_global_get(local_130,&local_1f8), uVar8 = local_1d0,
               CONCAT44(uStack_1ec,fStack_1f0) == 6)) {
              wasm_global_get(local_1d8,&local_1f8);
              if (((fStack_1f0 == 7.0) && (!NAN(fStack_1f0))) &&
                 (wasm_global_get(local_1e0,&local_1f8), CONCAT44(uStack_1ec,fStack_1f0) == 8)) {
                wasm_func_call(local_138,0,&local_1f8);
                if (((fStack_1f0 == 1.0) && (!NAN(fStack_1f0))) &&
                   (wasm_func_call(local_140,0,&local_1f8), CONCAT44(uStack_1ec,fStack_1f0) == 2)) {
                  wasm_func_call(local_188,0,&local_1f8);
                  if (((fStack_1f0 == 3.0) && (!NAN(fStack_1f0))) &&
                     (wasm_func_call(local_190,0,&local_1f8), CONCAT44(uStack_1ec,fStack_1f0) == 4))
                  {
                    wasm_func_call(local_148,0,&local_1f8);
                    if (((fStack_1f0 == 5.0) && (!NAN(fStack_1f0))) &&
                       (wasm_func_call(local_150,0,&local_1f8), CONCAT44(uStack_1ec,fStack_1f0) == 6
                       )) {
                      wasm_func_call(local_198,0,&local_1f8);
                      if (((fStack_1f0 == 7.0) && (!NAN(fStack_1f0))) &&
                         (wasm_func_call(local_1a0,0,&local_1f8),
                         CONCAT44(uStack_1ec,fStack_1f0) == 8)) {
                        local_1f8 = 2;
                        uStack_1f4 = 0;
                        fStack_1f0 = 33.0;
                        uStack_1ec = 0;
                        wasm_global_set(uVar6);
                        local_a8 = 1;
                        uStack_a4 = 0;
                        uStack_a0 = 0x22;
                        uStack_9c = 0;
                        wasm_global_set(uVar8);
                        local_b8 = 2;
                        uStack_b4 = 0;
                        uStack_b0 = 0x42140000;
                        uStack_ac = 0;
                        wasm_global_set(local_1d8);
                        local_c8 = 1;
                        uStack_c4 = 0;
                        uStack_c0 = 0x26;
                        uStack_bc = 0;
                        wasm_global_set(local_1e0);
                        wasm_global_get(uVar6,&local_1c8);
                        if (((fStack_1c0 == 33.0) && (!NAN(fStack_1c0))) &&
                           (wasm_global_get(uVar8,&local_1c8),
                           CONCAT44(uStack_1bc,fStack_1c0) == 0x22)) {
                          wasm_global_get(local_1d8,&local_1c8);
                          if (((fStack_1c0 == 37.0) && (!NAN(fStack_1c0))) &&
                             (wasm_global_get(local_1e0,&local_1c8),
                             CONCAT44(uStack_1bc,fStack_1c0) == 0x26)) {
                            wasm_func_call(local_188,0,&local_1c8);
                            if (((fStack_1c0 == 33.0) && (!NAN(fStack_1c0))) &&
                               (wasm_func_call(local_190,0,&local_1c8),
                               CONCAT44(uStack_1bc,fStack_1c0) == 0x22)) {
                              wasm_func_call(local_198,0,&local_1c8);
                              if (((fStack_1c0 == 37.0) && (!NAN(fStack_1c0))) &&
                                 (wasm_func_call(local_1a0,0,&local_1c8),
                                 CONCAT44(uStack_1bc,fStack_1c0) == 0x26)) {
                                local_1c8 = 2;
                                uStack_1c4 = 0;
                                fStack_1c0 = 73.0;
                                uStack_1bc = 0;
                                wasm_func_call(local_170,&local_1c8,0);
                                local_d8 = 1;
                                uStack_d4 = 0;
                                uStack_d0 = 0x4a;
                                uStack_cc = 0;
                                wasm_func_call(local_168,&local_d8,0);
                                local_e8 = 2;
                                uStack_e4 = 0;
                                uStack_e0 = 0x429a0000;
                                uStack_dc = 0;
                                wasm_func_call(local_160,&local_e8,0);
                                local_f8 = 1;
                                uStack_f4 = 0;
                                uStack_f0 = 0x4e;
                                uStack_ec = 0;
                                wasm_func_call(local_158,&local_f8,0);
                                wasm_global_get(uVar6,local_1b8);
                                if (((local_1b0 == 73.0) && (!NAN(local_1b0))) &&
                                   (wasm_global_get(uVar8,local_1b8),
                                   CONCAT44(uStack_1ac,local_1b0) == 0x4a)) {
                                  wasm_global_get(local_1d8,local_1b8);
                                  if (((local_1b0 == 77.0) && (!NAN(local_1b0))) &&
                                     (wasm_global_get(local_1e0,local_1b8),
                                     CONCAT44(uStack_1ac,local_1b0) == 0x4e)) {
                                    wasm_func_call(local_188,0,local_1b8);
                                    if (((local_1b0 == 73.0) && (!NAN(local_1b0))) &&
                                       (wasm_func_call(local_190,0,local_1b8),
                                       CONCAT44(uStack_1ac,local_1b0) == 0x4a)) {
                                      wasm_func_call(local_198,0,local_1b8);
                                      if ((local_1b0 == 77.0) && (!NAN(local_1b0))) {
                                        iVar3 = 0;
                                        wasm_func_call(local_1a0,0,local_1b8);
                                        if (CONCAT44(uStack_1ac,local_1b0) == 0x4e) {
                                          wasm_global_delete(local_178);
                                          wasm_global_delete(local_180);
                                          wasm_global_delete(uVar6);
                                          wasm_global_delete(local_1d0);
                                          wasm_extern_vec_delete(&local_108);
                                          wasm_instance_delete(lVar10);
                                          puts("Shutting down...");
                                          wasm_store_delete(uVar4);
                                          wasm_engine_delete(uVar7);
                                          pcVar12 = "Done.";
                                          goto LAB_00101e2d;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        puts("> Error reading value");
        exit(1);
      }
      pcVar12 = "> Error compiling module!";
      goto LAB_00101dfd;
    }
  }
  pcVar12 = "> Error loading module!";
LAB_00101dfd:
  puts(pcVar12);
  return 1;
}

Assistant:

int main(int argc, const char* argv[]) {
  // Initialize.
  printf("Initializing...\n");
  wasm_engine_t* engine = wasm_engine_new();
  wasm_store_t* store = wasm_store_new(engine);

  // Load binary.
  printf("Loading binary...\n");
  FILE* file = fopen("global.wasm", "r");
  if (!file) {
    printf("> Error loading module!\n");
    return 1;
  }
  fseek(file, 0L, SEEK_END);
  size_t file_size = ftell(file);
  fseek(file, 0L, SEEK_SET);
  wasm_byte_vec_t binary;
  wasm_byte_vec_new_uninitialized(&binary, file_size);
  if (fread(binary.data, file_size, 1, file) != 1) {
    printf("> Error loading module!\n");
    return 1;
  }
  fclose(file);

  // Compile.
  printf("Compiling module...\n");
  own wasm_module_t* module = wasm_module_new(store, &binary);
  if (!module) {
    printf("> Error compiling module!\n");
    return 1;
  }

  wasm_byte_vec_delete(&binary);

  // Create external globals.
  printf("Creating globals...\n");
  own wasm_globaltype_t* const_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_CONST);
  own wasm_globaltype_t* const_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_CONST);
  own wasm_globaltype_t* var_f32_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_F32), WASM_VAR);
  own wasm_globaltype_t* var_i64_type = wasm_globaltype_new(
    wasm_valtype_new(WASM_I64), WASM_VAR);

  wasm_val_t val_f32_1 = {.kind = WASM_F32, .of = {.f32 = 1}};
  own wasm_global_t* const_f32_import =
    wasm_global_new(store, const_f32_type, &val_f32_1);
  wasm_val_t val_i64_2 = {.kind = WASM_I64, .of = {.i64 = 2}};
  own wasm_global_t* const_i64_import =
    wasm_global_new(store, const_i64_type, &val_i64_2);
  wasm_val_t val_f32_3 = {.kind = WASM_F32, .of = {.f32 = 3}};
  own wasm_global_t* var_f32_import =
    wasm_global_new(store, var_f32_type, &val_f32_3);
  wasm_val_t val_i64_4 = {.kind = WASM_I64, .of = {.i64 = 4}};
  own wasm_global_t* var_i64_import =
    wasm_global_new(store, var_i64_type, &val_i64_4);

  wasm_globaltype_delete(const_f32_type);
  wasm_globaltype_delete(const_i64_type);
  wasm_globaltype_delete(var_f32_type);
  wasm_globaltype_delete(var_i64_type);

  // Instantiate.
  printf("Instantiating module...\n");
  const wasm_extern_t* imports[] = {
    wasm_global_as_extern(const_f32_import),
    wasm_global_as_extern(const_i64_import),
    wasm_global_as_extern(var_f32_import),
    wasm_global_as_extern(var_i64_import)
  };
  own wasm_instance_t* instance =
    wasm_instance_new(store, module, imports, NULL);
  if (!instance) {
    printf("> Error instantiating module!\n");
    return 1;
  }

  wasm_module_delete(module);

  // Extract export.
  printf("Extracting exports...\n");
  own wasm_extern_vec_t exports;
  wasm_instance_exports(instance, &exports);
  size_t i = 0;
  wasm_global_t* const_f32_export = get_export_global(&exports, i++);
  wasm_global_t* const_i64_export = get_export_global(&exports, i++);
  wasm_global_t* var_f32_export = get_export_global(&exports, i++);
  wasm_global_t* var_i64_export = get_export_global(&exports, i++);
  wasm_func_t* get_const_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* get_const_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_const_i64_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* get_var_i64_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_import = get_export_func(&exports, i++);
  wasm_func_t* set_var_f32_export = get_export_func(&exports, i++);
  wasm_func_t* set_var_i64_export = get_export_func(&exports, i++);

  // Try cloning.
  own wasm_global_t* copy = wasm_global_copy(var_f32_import);
  assert(wasm_global_same(var_f32_import, copy));
  wasm_global_delete(copy);

  // Interact.
  printf("Accessing globals...\n");

  // Check initial values.
  check_global(const_f32_import, f32, 1);
  check_global(const_i64_import, i64, 2);
  check_global(var_f32_import, f32, 3);
  check_global(var_i64_import, i64, 4);
  check_global(const_f32_export, f32, 5);
  check_global(const_i64_export, i64, 6);
  check_global(var_f32_export, f32, 7);
  check_global(var_i64_export, i64, 8);

  check_call(get_const_f32_import, f32, 1);
  check_call(get_const_i64_import, i64, 2);
  check_call(get_var_f32_import, f32, 3);
  check_call(get_var_i64_import, i64, 4);
  check_call(get_const_f32_export, f32, 5);
  check_call(get_const_i64_export, i64, 6);
  check_call(get_var_f32_export, f32, 7);
  check_call(get_var_i64_export, i64, 8);

  // Modify variables through API and check again.
  wasm_val_t val33 = {.kind = WASM_F32, .of = {.f32 = 33}};
  wasm_global_set(var_f32_import, &val33);
  wasm_val_t val34 = {.kind = WASM_I64, .of = {.i64 = 34}};
  wasm_global_set(var_i64_import, &val34);
  wasm_val_t val37 = {.kind = WASM_F32, .of = {.f32 = 37}};
  wasm_global_set(var_f32_export, &val37);
  wasm_val_t val38 = {.kind = WASM_I64, .of = {.i64 = 38}};
  wasm_global_set(var_i64_export, &val38);

  check_global(var_f32_import, f32, 33);
  check_global(var_i64_import, i64, 34);
  check_global(var_f32_export, f32, 37);
  check_global(var_i64_export, i64, 38);

  check_call(get_var_f32_import, f32, 33);
  check_call(get_var_i64_import, i64, 34);
  check_call(get_var_f32_export, f32, 37);
  check_call(get_var_i64_export, i64, 38);

  // Modify variables through calls and check again.
  wasm_val_t args73[] = { {.kind = WASM_F32, .of = {.f32 = 73}} };
  wasm_func_call(set_var_f32_import, args73, NULL);
  wasm_val_t args74[] = { {.kind = WASM_I64, .of = {.i64 = 74}} };
  wasm_func_call(set_var_i64_import, args74, NULL);
  wasm_val_t args77[] = { {.kind = WASM_F32, .of = {.f32 = 77}} };
  wasm_func_call(set_var_f32_export, args77, NULL);
  wasm_val_t args78[] = { {.kind = WASM_I64, .of = {.i64 = 78}} };
  wasm_func_call(set_var_i64_export, args78, NULL);

  check_global(var_f32_import, f32, 73);
  check_global(var_i64_import, i64, 74);
  check_global(var_f32_export, f32, 77);
  check_global(var_i64_export, i64, 78);

  check_call(get_var_f32_import, f32, 73);
  check_call(get_var_i64_import, i64, 74);
  check_call(get_var_f32_export, f32, 77);
  check_call(get_var_i64_export, i64, 78);

  wasm_global_delete(const_f32_import);
  wasm_global_delete(const_i64_import);
  wasm_global_delete(var_f32_import);
  wasm_global_delete(var_i64_import);
  wasm_extern_vec_delete(&exports);
  wasm_instance_delete(instance);

  // Shut down.
  printf("Shutting down...\n");
  wasm_store_delete(store);
  wasm_engine_delete(engine);

  // All done.
  printf("Done.\n");
  return 0;
}